

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingTesselationControlShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_tesselation_control_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  char cVar2;
  int iVar3;
  attributeDefinition *paVar4;
  ostream *poVar5;
  size_t sVar6;
  long *plVar7;
  GLuint n_components;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  attributeDefinition *paVar12;
  bool *local_220;
  char *local_218;
  string sampling_code;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  sampling_function_00 = *sampling_function;
  n_components = 0;
  switch(sampling_function_00) {
  case Texture:
    paVar12 = getAttributes::texture_attributes;
    goto LAB_00d73916;
  case TextureLod:
    paVar12 = getAttributes::textureLod_attributes;
    iVar9 = 2;
    break;
  case TextureGrad:
    paVar12 = getAttributes::textureGrad_attributes;
    iVar9 = 3;
    break;
  case TextureGather:
    paVar12 = getAttributes::textureGather_attributes;
LAB_00d73916:
    iVar9 = 1;
    break;
  default:
    bVar8 = false;
    iVar9 = 0;
    paVar12 = (attributeDefinition *)0x0;
    goto LAB_00d7392e;
  }
  bVar8 = true;
LAB_00d7392e:
  sVar1 = *sampler_type;
  paVar4 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    paVar4 = (attributeDefinition *)0x0;
  }
  local_218 = (GLchar *)0x0;
  local_220 = (bool *)0x0;
  pcVar10 = (char *)0x0;
  switch(sVar1) {
  case Float:
    pcVar10 = "samplerCubeArray ";
    n_components = 4;
    local_220 = fixed_sample_locations_values + 1;
    local_218 = "vec4 ";
    break;
  case Int:
    pcVar10 = "isamplerCubeArray ";
    n_components = 4;
    local_220 = (bool *)0x1b3c8c1;
    local_218 = "ivec4 ";
    break;
  case UInt:
    pcVar10 = "usamplerCubeArray ";
    n_components = 4;
    local_220 = (bool *)0x1b3c8c1;
    local_218 = "uvec4 ";
    break;
  case Depth:
    local_218 = "float ";
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x1a6545f,sampling_function_00,"float ",1,
               "vs_out_","gl_InvocationID","tes_in_color","gl_InvocationID","sampler",&sampling_code
              );
    local_220 = fixed_sample_locations_values + 1;
    pcVar10 = "samplerCubeArrayShadow ";
    goto LAB_00d73a9a;
  case Stencil:
    pcVar10 = "usamplerCubeArray ";
    n_components = 1;
    local_220 = (bool *)0x1b3c8c1;
    local_218 = "uint ";
  }
  getSamplingFunctionCall
            ((TextureCubeMapArraySamplingTest *)0x1a6545f,sampling_function_00,local_218,
             n_components,"vs_out_","gl_InvocationID","tes_in_color","gl_InvocationID","sampler",
             &sampling_code);
LAB_00d73a9a:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${TESSELLATION_SHADER_REQUIRE}\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"/* Sampling tesselation control shader */",0x29);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(vertices = 1) out;\n\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  iVar3 = (int)(ostream *)local_1a8;
  if (pcVar10 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar6 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sampler",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (bVar8) {
    lVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar10 = *(char **)((long)&paVar12->type + lVar11);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar6 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_out_",7);
      pcVar10 = *(char **)((long)&paVar12->name + lVar11);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar6 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[];",3);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar11 = lVar11 + 0x18;
    } while ((ulong)(iVar9 + (uint)(iVar9 == 0)) * 0x18 != lVar11);
  }
  if (sVar1 == Depth) {
    bVar8 = true;
    lVar11 = 0;
    while (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar10 = paVar4[lVar11].type;
      if (pcVar10 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar6 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_out_",7);
      pcVar10 = paVar4[lVar11].name;
      if (pcVar10 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar6 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[];",3);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      lVar11 = 1;
      bVar8 = false;
      std::ostream::flush();
    }
  }
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (local_220 == (bool *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar6 = strlen(local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_220,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
  if (local_218 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar6 = strlen(local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_218,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"tes_in_color",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[];",3);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void main()\n{\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
             ,0x11c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,sampling_code._M_dataplus._M_p,sampling_code._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  plVar7 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_tesselation_control_shader_code,(string *)local_1d8)
  ;
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sampling_code._M_dataplus._M_p != &sampling_code.field_2) {
    operator_delete(sampling_code._M_dataplus._M_p,
                    CONCAT71(sampling_code.field_2._M_allocated_capacity._1_7_,
                             sampling_code.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingTesselationControlShaderCode(
	const samplerType& sampler_type, const samplingFunction& sampling_function,
	std::string& out_tesselation_control_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_output, "gl_InvocationID",
								tesselation_evaluation_shader_input, "gl_InvocationID", sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_output,
									  "gl_InvocationID", tesselation_evaluation_shader_input, "gl_InvocationID",
									  sampler_name, sampling_code);
	}

	/* Preamble, extension : require  */
	stream << shader_code_preamble << tesselation_shader_extension << shader_precision << std::endl
		   << "/* Sampling tesselation control shader */" << std::endl;

	/* layout(vertices = 1) out */
	stream << tesselation_control_shader_layout;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	stream << std::endl;

	/* in type attribute[]*/
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << shader_input << routine_attribute_definitions[i].type << vertex_shader_output
			   << routine_attribute_definitions[i].name << "[];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << shader_input << type_attribute_definitions[i].type << vertex_shader_output
			   << type_attribute_definitions[i].name << "[];" << std::endl;
	}

	stream << std::endl;

	/* out vec4 tes_in_color */
	stream << interpolation_type << shader_output << color_type << tesselation_evaluation_shader_input << "[];"
		   << std::endl;

	stream << std::endl;

	/* Body */
	stream << tesselation_control_shader_sampling_body_code;

	/* Sampling code */
	stream << sampling_code;

	stream << "}" << std::endl << std::endl;

	/* Store result */
	out_tesselation_control_shader_code = stream.str();
}